

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

size_t __thiscall
absl::lts_20250127::anon_unknown_0::CEscapedLength(anon_unknown_0 *this,string_view src)

{
  size_t sVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  byte *pbVar4;
  size_type sVar5;
  int local_b8 [2];
  char *local_b0;
  char *absl_raw_log_internal_filename;
  string local_a0 [55];
  allocator<char> local_69;
  undefined1 local_68 [8];
  string death_message;
  size_t char_len;
  size_t i;
  size_type local_30;
  ulong local_28;
  size_t unchecked_limit;
  size_t escaped_len;
  string_view src_local;
  
  src_local._M_len = src._M_len;
  unchecked_limit = 0;
  escaped_len = (size_t)this;
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&escaped_len);
  uVar2 = std::numeric_limits<unsigned_long>::max();
  i = uVar2 >> 2;
  puVar3 = std::min<unsigned_long>(&local_30,&i);
  local_28 = *puVar3;
  char_len = 0;
  while (char_len < local_28) {
    pbVar4 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)&escaped_len,
                                char_len);
    pbVar4 = std::array<unsigned_char,_256UL>::operator[]
                       ((array<unsigned_char,_256UL> *)
                        lts_20250127::(anonymous_namespace)::kCEscapedLen,(ulong)*pbVar4);
    unchecked_limit = *pbVar4 + unchecked_limit;
    char_len = char_len + 1;
  }
  while( true ) {
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&escaped_len);
    if (sVar5 <= char_len) {
      return unchecked_limit;
    }
    pbVar4 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)&escaped_len,
                                char_len);
    pbVar4 = std::array<unsigned_char,_256UL>::operator[]
                       ((array<unsigned_char,_256UL> *)
                        lts_20250127::(anonymous_namespace)::kCEscapedLen,(ulong)*pbVar4);
    sVar1 = unchecked_limit;
    death_message.field_2._8_8_ = ZEXT18(*pbVar4);
    uVar2 = std::numeric_limits<unsigned_long>::max();
    if (uVar2 - death_message.field_2._8_8_ < sVar1) break;
    unchecked_limit = death_message.field_2._8_8_ + unchecked_limit;
    char_len = char_len + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,
             "Check escaped_len <= std::numeric_limits<size_t>::max() - char_len failed: ",&local_69
            );
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"escaped_len overflow",
             (allocator<char> *)((long)&absl_raw_log_internal_filename + 7));
  std::__cxx11::string::operator+=((string *)local_68,local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&absl_raw_log_internal_filename + 7));
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/escaping.cc"
  ;
  local_b8[1] = 3;
  local_b8[0] = 0x1be;
  base_internal::
  AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::
  operator()((AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
              *)raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_b8 + 1),
             &local_b0,local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/escaping.cc"
                ,0x1be,
                "size_t absl::lts_20250127::(anonymous namespace)::CEscapedLength(absl::string_view)"
               );
}

Assistant:

inline size_t CEscapedLength(absl::string_view src) {
  size_t escaped_len = 0;
  // The maximum value of kCEscapedLen[x] is 4, so we can escape any string of
  // length size_t_max/4 without checking for overflow.
  size_t unchecked_limit =
      std::min<size_t>(src.size(), std::numeric_limits<size_t>::max() / 4);
  size_t i = 0;
  while (i < unchecked_limit) {
    // Common case: No need to check for overflow.
    escaped_len += kCEscapedLen[static_cast<unsigned char>(src[i++])];
  }
  while (i < src.size()) {
    // Beyond unchecked_limit we need to check for overflow before adding.
    size_t char_len = kCEscapedLen[static_cast<unsigned char>(src[i++])];
    ABSL_INTERNAL_CHECK(
        escaped_len <= std::numeric_limits<size_t>::max() - char_len,
        "escaped_len overflow");
    escaped_len += char_len;
  }
  return escaped_len;
}